

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  int iVar30;
  int iVar31;
  parasail_result_t *ppVar32;
  __m128i *ptr;
  __m128i *palVar33;
  __m128i *ptr_00;
  int16_t *ptr_01;
  long lVar34;
  undefined2 uVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  int32_t segNum;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  int iVar45;
  __m128i *ptr_02;
  undefined8 unaff_R14;
  ushort uVar46;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  int iVar52;
  ushort uVar59;
  int iVar61;
  ushort uVar64;
  int iVar66;
  ushort uVar69;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar57;
  ushort uVar62;
  ushort uVar67;
  int iVar71;
  ushort uVar72;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  short sVar77;
  short sVar78;
  undefined1 auVar79 [16];
  short sVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ulong uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar95 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar96 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar47;
  short sVar58;
  short sVar60;
  short sVar63;
  short sVar65;
  short sVar68;
  short sVar70;
  short sVar73;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_1();
        }
        else {
          uVar29 = uVar3 - 1;
          uVar43 = (ulong)uVar3 + 7 >> 3;
          iVar38 = -open;
          iVar31 = ppVar5->min;
          iVar39 = -iVar31;
          if (iVar31 != iVar38 && SBORROW4(iVar31,iVar38) == iVar31 + open < 0) {
            iVar39 = open;
          }
          iVar31 = ppVar5->max;
          ppVar32 = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
          if (ppVar32 != (parasail_result_t *)0x0) {
            iVar45 = (int)(uVar29 / uVar43);
            ppVar32->flag = ppVar32->flag | 0x8220801;
            ptr = parasail_memalign___m128i(0x10,uVar43);
            palVar33 = parasail_memalign___m128i(0x10,uVar43);
            ptr_00 = parasail_memalign___m128i(0x10,uVar43);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar33 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar30 = s2Len + -1;
              auVar53 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar48 = auVar53._0_4_;
              auVar53 = pshuflw(auVar53,ZEXT416((uint)gap),0);
              uVar49 = auVar53._0_4_;
              auVar53 = pshuflw(ZEXT416(iVar39 - 0x7fff),ZEXT416(iVar39 - 0x7fff),0);
              uVar50 = auVar53._0_4_;
              auVar54 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R14 >> 0x10),
                                               0x7ffe - (short)iVar31));
              auVar54 = pshuflw(auVar54,auVar54,0);
              lVar34 = (long)iVar38;
              uVar44 = 0;
              do {
                lVar42 = 0;
                lVar40 = lVar34;
                do {
                  uVar35 = 0x8000;
                  if (-0x8000 < lVar40) {
                    uVar35 = (undefined2)lVar40;
                  }
                  *(undefined2 *)((long)&local_48 + lVar42 * 2) = uVar35;
                  lVar36 = lVar40 - (ulong)(uint)open;
                  if (lVar36 < -0x7fff) {
                    lVar36 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar42 * 2) = (short)lVar36;
                  lVar42 = lVar42 + 1;
                  lVar40 = lVar40 - uVar43 * (uint)gap;
                } while (lVar42 != 8);
                ptr[uVar44][0] = local_48;
                ptr[uVar44][1] = lStack_40;
                ptr_00[uVar44][0] = local_58;
                ptr_00[uVar44][1] = lStack_50;
                uVar44 = uVar44 + 1;
                lVar34 = lVar34 - (ulong)(uint)gap;
              } while (uVar44 != uVar43);
              *ptr_01 = 0;
              auVar28 = _DAT_00906ca0;
              uVar44 = (ulong)(uint)s2Len;
              lVar34 = uVar44 - 1;
              auVar79._8_4_ = (int)lVar34;
              auVar79._0_8_ = lVar34;
              auVar79._12_4_ = (int)((ulong)lVar34 >> 0x20);
              auVar75._4_4_ = gap;
              auVar75._0_4_ = gap;
              auVar75._8_4_ = gap;
              auVar75._12_4_ = gap;
              iVar31 = -gap;
              iVar39 = 0;
              auVar95 = pmovsxbq(in_XMM10,0x100);
              auVar79 = auVar79 ^ _DAT_00906ca0;
              auVar96 = pmovsxbd(in_XMM13,0x7060504);
              auVar97 = pmovsxwd(in_XMM14,0x8000800080008000);
              uVar41 = 0;
              do {
                uVar51 = (undefined4)uVar41;
                auVar90._8_4_ = uVar51;
                auVar90._0_8_ = uVar41;
                auVar90._12_4_ = (int)(uVar41 >> 0x20);
                auVar98 = (auVar90 | auVar95) ^ auVar28;
                lVar34 = auVar79._0_8_;
                auVar99._0_8_ = -(ulong)(lVar34 < auVar98._0_8_);
                lVar40 = auVar79._8_8_;
                auVar99._8_8_ = -(ulong)(lVar40 < auVar98._8_8_);
                auVar92 = pshuflw(in_XMM8,auVar99,0xe8);
                auVar98._8_4_ = 0xffffffff;
                auVar98._0_8_ = 0xffffffffffffffff;
                auVar98._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar92 ^ auVar98,auVar92 ^ auVar98);
                auVar92._4_4_ = iVar31;
                auVar92._0_4_ = iVar38;
                auVar92._8_8_ = 0;
                iVar52 = iVar38 - iVar39;
                iVar61 = iVar31 - open;
                iVar66 = iVar38 - (gap * 2 + iVar39);
                iVar71 = iVar38 - (gap * 3 + iVar39);
                iVar13 = auVar97._0_4_;
                iVar14 = auVar97._4_4_;
                iVar15 = auVar97._8_4_;
                iVar16 = auVar97._12_4_;
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 1] =
                       (ushort)(iVar52 < iVar13) * auVar97._0_2_ |
                       (ushort)(iVar52 >= iVar13) * (short)iVar52;
                }
                auVar99 = packssdw(auVar99,auVar99);
                auVar21._8_4_ = 0xffffffff;
                auVar21._0_8_ = 0xffffffffffffffff;
                auVar21._12_4_ = 0xffffffff;
                auVar99 = packssdw(auVar99 ^ auVar21,auVar99 ^ auVar21);
                if ((auVar99 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 2] =
                       (ushort)(iVar61 < iVar14) * auVar97._4_2_ |
                       (ushort)(iVar61 >= iVar14) * (short)iVar61;
                }
                auVar99 = (auVar90 | _DAT_00903a80) ^ auVar28;
                auVar100._0_8_ = -(ulong)(lVar34 < auVar99._0_8_);
                auVar100._8_8_ = -(ulong)(lVar40 < auVar99._8_8_);
                auVar98 = packssdw(auVar98,auVar100);
                auVar22._8_4_ = 0xffffffff;
                auVar22._0_8_ = 0xffffffffffffffff;
                auVar22._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar22,auVar98 ^ auVar22);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 3] =
                       (ushort)(iVar66 < iVar15) * auVar97._8_2_ |
                       (ushort)(iVar66 >= iVar15) * (short)iVar66;
                }
                auVar98 = pshufhw(auVar98,auVar100,0x84);
                auVar23._8_4_ = 0xffffffff;
                auVar23._0_8_ = 0xffffffffffffffff;
                auVar23._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar23,auVar98 ^ auVar23);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 4] =
                       (ushort)(iVar71 < iVar16) * auVar97._12_2_ |
                       (ushort)(iVar71 >= iVar16) * (short)iVar71;
                }
                auVar93._4_4_ = uVar51;
                auVar93._0_4_ = uVar51;
                auVar93._8_4_ = uVar51;
                auVar93._12_4_ = uVar51;
                in_XMM8 = pmulld(auVar93 | auVar96,auVar75);
                iVar52 = iVar38 - in_XMM8._0_4_;
                iVar61 = iVar38 - in_XMM8._4_4_;
                iVar66 = iVar38 - in_XMM8._8_4_;
                iVar71 = iVar38 - in_XMM8._12_4_;
                auVar98 = (auVar90 | _DAT_00903ad0) ^ auVar28;
                auVar101._0_8_ = -(ulong)(lVar34 < auVar98._0_8_);
                auVar101._8_8_ = -(ulong)(lVar40 < auVar98._8_8_);
                auVar98 = pshuflw(auVar92,auVar101,0xe8);
                auVar24._8_4_ = 0xffffffff;
                auVar24._0_8_ = 0xffffffffffffffff;
                auVar24._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar24,auVar98 ^ auVar24);
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 5] =
                       (ushort)(iVar52 < iVar13) * auVar97._0_2_ |
                       (ushort)(iVar52 >= iVar13) * (short)iVar52;
                }
                auVar92 = packssdw(auVar101,auVar101);
                auVar25._8_4_ = 0xffffffff;
                auVar25._0_8_ = 0xffffffffffffffff;
                auVar25._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98,auVar92 ^ auVar25);
                if ((auVar98 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 6] =
                       (ushort)(iVar61 < iVar14) * auVar97._4_2_ |
                       (ushort)(iVar61 >= iVar14) * (short)iVar61;
                }
                auVar92 = (auVar90 | _DAT_00903ac0) ^ auVar28;
                auVar91._0_8_ = -(ulong)(lVar34 < auVar92._0_8_);
                auVar91._8_8_ = -(ulong)(lVar40 < auVar92._8_8_);
                auVar98 = packssdw(auVar98,auVar91);
                auVar26._8_4_ = 0xffffffff;
                auVar26._0_8_ = 0xffffffffffffffff;
                auVar26._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar26,auVar98 ^ auVar26);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 7] =
                       (ushort)(iVar66 < iVar15) * auVar97._8_2_ |
                       (ushort)(iVar66 >= iVar15) * (short)iVar66;
                }
                auVar98 = pshufhw(auVar98,auVar91,0x84);
                auVar27._8_4_ = 0xffffffff;
                auVar27._0_8_ = 0xffffffffffffffff;
                auVar27._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar27,auVar98 ^ auVar27);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar41 + 8] =
                       (ushort)(iVar71 < iVar16) * auVar97._12_2_ |
                       (ushort)(iVar71 >= iVar16) * (short)iVar71;
                }
                uVar41 = uVar41 + 8;
                iVar31 = iVar31 + gap * -8;
                iVar39 = iVar39 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar41);
              lVar34 = uVar43 * uVar44;
              lVar40 = 0;
              uVar41 = 0;
              auVar28._4_4_ = uVar50;
              auVar28._0_4_ = uVar50;
              auVar28._8_4_ = uVar50;
              auVar28._12_4_ = uVar50;
              local_78 = auVar54._0_2_;
              uStack_76 = auVar54._2_2_;
              auVar54 = auVar28;
              uVar81 = local_78;
              uVar82 = uStack_76;
              uVar83 = local_78;
              uVar84 = uStack_76;
              uVar85 = local_78;
              uVar86 = uStack_76;
              uVar87 = local_78;
              uVar88 = uStack_76;
              do {
                ptr_02 = ptr;
                ptr = palVar33;
                uVar37 = ptr_02[(int)uVar43 - 1][0];
                iVar31 = ppVar5->mapper[(byte)s2[uVar41]];
                auVar95._8_8_ = ptr_02[(int)uVar43 - 1][1] << 0x10 | uVar37 >> 0x30;
                auVar95._0_8_ = uVar37 << 0x10 | (ulong)(ushort)ptr_01[uVar41];
                lVar36 = 0;
                lVar42 = lVar40;
                auVar79 = auVar54;
                auVar96 = auVar28;
                do {
                  auVar54 = paddsw(auVar95,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar36 + uVar43 * (long)iVar31 * 0x10));
                  auVar75 = *(undefined1 (*) [16])((long)*ptr_00 + lVar36);
                  sVar78 = auVar96._0_2_;
                  sVar47 = auVar75._0_2_;
                  uVar46 = (ushort)(sVar47 < sVar78) * sVar78 | (ushort)(sVar47 >= sVar78) * sVar47;
                  sVar7 = auVar96._2_2_;
                  sVar58 = auVar75._2_2_;
                  uVar57 = (ushort)(sVar58 < sVar7) * sVar7 | (ushort)(sVar58 >= sVar7) * sVar58;
                  sVar8 = auVar96._4_2_;
                  sVar60 = auVar75._4_2_;
                  uVar59 = (ushort)(sVar60 < sVar8) * sVar8 | (ushort)(sVar60 >= sVar8) * sVar60;
                  sVar9 = auVar96._6_2_;
                  sVar63 = auVar75._6_2_;
                  uVar62 = (ushort)(sVar63 < sVar9) * sVar9 | (ushort)(sVar63 >= sVar9) * sVar63;
                  sVar10 = auVar96._8_2_;
                  sVar65 = auVar75._8_2_;
                  uVar64 = (ushort)(sVar65 < sVar10) * sVar10 | (ushort)(sVar65 >= sVar10) * sVar65;
                  sVar11 = auVar96._10_2_;
                  sVar68 = auVar75._10_2_;
                  uVar67 = (ushort)(sVar68 < sVar11) * sVar11 | (ushort)(sVar68 >= sVar11) * sVar68;
                  sVar12 = auVar96._12_2_;
                  sVar70 = auVar75._12_2_;
                  sVar73 = auVar75._14_2_;
                  uVar69 = (ushort)(sVar70 < sVar12) * sVar12 | (ushort)(sVar70 >= sVar12) * sVar70;
                  sVar74 = auVar96._14_2_;
                  uVar72 = (ushort)(sVar73 < sVar74) * sVar74 | (ushort)(sVar73 >= sVar74) * sVar73;
                  sVar77 = auVar54._0_2_;
                  auVar55._0_2_ =
                       (ushort)((short)uVar46 < sVar77) * sVar77 |
                       ((short)uVar46 >= sVar77) * uVar46;
                  sVar77 = auVar54._2_2_;
                  auVar55._2_2_ =
                       (ushort)((short)uVar57 < sVar77) * sVar77 |
                       ((short)uVar57 >= sVar77) * uVar57;
                  sVar77 = auVar54._4_2_;
                  auVar55._4_2_ =
                       (ushort)((short)uVar59 < sVar77) * sVar77 |
                       ((short)uVar59 >= sVar77) * uVar59;
                  sVar77 = auVar54._6_2_;
                  auVar55._6_2_ =
                       (ushort)((short)uVar62 < sVar77) * sVar77 |
                       ((short)uVar62 >= sVar77) * uVar62;
                  sVar77 = auVar54._8_2_;
                  auVar55._8_2_ =
                       (ushort)((short)uVar64 < sVar77) * sVar77 |
                       ((short)uVar64 >= sVar77) * uVar64;
                  sVar77 = auVar54._10_2_;
                  auVar55._10_2_ =
                       (ushort)((short)uVar67 < sVar77) * sVar77 |
                       ((short)uVar67 >= sVar77) * uVar67;
                  sVar77 = auVar54._12_2_;
                  auVar55._12_2_ =
                       (ushort)((short)uVar69 < sVar77) * sVar77 |
                       ((short)uVar69 >= sVar77) * uVar69;
                  sVar77 = auVar54._14_2_;
                  auVar55._14_2_ =
                       (ushort)((short)uVar72 < sVar77) * sVar77 |
                       ((short)uVar72 >= sVar77) * uVar72;
                  *(undefined1 (*) [16])((long)*ptr + lVar36) = auVar55;
                  piVar6 = ((ppVar32->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar42) = (int)(short)auVar55._0_2_;
                  *(int *)((long)piVar6 + lVar34 * 4 + lVar42) = (int)(short)auVar55._2_2_;
                  *(int *)((long)piVar6 + lVar34 * 8 + lVar42) = (int)(short)auVar55._4_2_;
                  *(int *)((long)piVar6 + lVar34 * 0xc + lVar42) = (int)(short)auVar55._6_2_;
                  *(int *)((long)piVar6 + lVar34 * 0x10 + lVar42) = (int)(short)auVar55._8_2_;
                  *(int *)((long)piVar6 + lVar34 * 0x14 + lVar42) = (int)(short)auVar55._10_2_;
                  *(int *)((long)piVar6 + lVar34 * 0x18 + lVar42) = (int)(short)auVar55._12_2_;
                  *(int *)((long)piVar6 + lVar34 * 0x1c + lVar42) = (int)(short)auVar55._14_2_;
                  sVar77 = auVar79._0_2_;
                  auVar54._0_2_ =
                       (sVar77 < (short)auVar55._0_2_) * auVar55._0_2_ |
                       (ushort)(sVar77 >= (short)auVar55._0_2_) * sVar77;
                  sVar77 = auVar79._2_2_;
                  auVar54._2_2_ =
                       (sVar77 < (short)auVar55._2_2_) * auVar55._2_2_ |
                       (ushort)(sVar77 >= (short)auVar55._2_2_) * sVar77;
                  sVar77 = auVar79._4_2_;
                  auVar54._4_2_ =
                       (sVar77 < (short)auVar55._4_2_) * auVar55._4_2_ |
                       (ushort)(sVar77 >= (short)auVar55._4_2_) * sVar77;
                  sVar77 = auVar79._6_2_;
                  auVar54._6_2_ =
                       (sVar77 < (short)auVar55._6_2_) * auVar55._6_2_ |
                       (ushort)(sVar77 >= (short)auVar55._6_2_) * sVar77;
                  sVar77 = auVar79._8_2_;
                  auVar54._8_2_ =
                       (sVar77 < (short)auVar55._8_2_) * auVar55._8_2_ |
                       (ushort)(sVar77 >= (short)auVar55._8_2_) * sVar77;
                  sVar77 = auVar79._10_2_;
                  auVar54._10_2_ =
                       (sVar77 < (short)auVar55._10_2_) * auVar55._10_2_ |
                       (ushort)(sVar77 >= (short)auVar55._10_2_) * sVar77;
                  sVar77 = auVar79._12_2_;
                  sVar80 = auVar79._14_2_;
                  auVar54._12_2_ =
                       (sVar77 < (short)auVar55._12_2_) * auVar55._12_2_ |
                       (ushort)(sVar77 >= (short)auVar55._12_2_) * sVar77;
                  auVar54._14_2_ =
                       (sVar80 < (short)auVar55._14_2_) * auVar55._14_2_ |
                       (ushort)(sVar80 >= (short)auVar55._14_2_) * sVar80;
                  uVar81 = (ushort)(sVar47 < (short)uVar81) * sVar47 |
                           (sVar47 >= (short)uVar81) * uVar81;
                  uVar82 = (ushort)(sVar58 < (short)uVar82) * sVar58 |
                           (sVar58 >= (short)uVar82) * uVar82;
                  uVar83 = (ushort)(sVar60 < (short)uVar83) * sVar60 |
                           (sVar60 >= (short)uVar83) * uVar83;
                  uVar84 = (ushort)(sVar63 < (short)uVar84) * sVar63 |
                           (sVar63 >= (short)uVar84) * uVar84;
                  uVar85 = (ushort)(sVar65 < (short)uVar85) * sVar65 |
                           (sVar65 >= (short)uVar85) * uVar85;
                  uVar86 = (ushort)(sVar68 < (short)uVar86) * sVar68 |
                           (sVar68 >= (short)uVar86) * uVar86;
                  uVar87 = (ushort)(sVar70 < (short)uVar87) * sVar70 |
                           (sVar70 >= (short)uVar87) * uVar87;
                  uVar88 = (ushort)(sVar73 < (short)uVar88) * sVar73 |
                           (sVar73 >= (short)uVar88) * uVar88;
                  uVar81 = (ushort)(sVar78 < (short)uVar81) * sVar78 |
                           (sVar78 >= (short)uVar81) * uVar81;
                  uVar82 = (ushort)(sVar7 < (short)uVar82) * sVar7 |
                           (sVar7 >= (short)uVar82) * uVar82;
                  uVar83 = (ushort)(sVar8 < (short)uVar83) * sVar8 |
                           (sVar8 >= (short)uVar83) * uVar83;
                  uVar84 = (ushort)(sVar9 < (short)uVar84) * sVar9 |
                           (sVar9 >= (short)uVar84) * uVar84;
                  uVar85 = (ushort)(sVar10 < (short)uVar85) * sVar10 |
                           (sVar10 >= (short)uVar85) * uVar85;
                  uVar86 = (ushort)(sVar11 < (short)uVar86) * sVar11 |
                           (sVar11 >= (short)uVar86) * uVar86;
                  uVar87 = (ushort)(sVar12 < (short)uVar87) * sVar12 |
                           (sVar12 >= (short)uVar87) * uVar87;
                  uVar88 = (ushort)(sVar74 < (short)uVar88) * sVar74 |
                           (sVar74 >= (short)uVar88) * uVar88;
                  uVar81 = ((short)auVar55._0_2_ < (short)uVar81) * auVar55._0_2_ |
                           ((short)auVar55._0_2_ >= (short)uVar81) * uVar81;
                  uVar82 = ((short)auVar55._2_2_ < (short)uVar82) * auVar55._2_2_ |
                           ((short)auVar55._2_2_ >= (short)uVar82) * uVar82;
                  uVar83 = ((short)auVar55._4_2_ < (short)uVar83) * auVar55._4_2_ |
                           ((short)auVar55._4_2_ >= (short)uVar83) * uVar83;
                  uVar84 = ((short)auVar55._6_2_ < (short)uVar84) * auVar55._6_2_ |
                           ((short)auVar55._6_2_ >= (short)uVar84) * uVar84;
                  uVar85 = ((short)auVar55._8_2_ < (short)uVar85) * auVar55._8_2_ |
                           ((short)auVar55._8_2_ >= (short)uVar85) * uVar85;
                  uVar86 = ((short)auVar55._10_2_ < (short)uVar86) * auVar55._10_2_ |
                           ((short)auVar55._10_2_ >= (short)uVar86) * uVar86;
                  uVar87 = ((short)auVar55._12_2_ < (short)uVar87) * auVar55._12_2_ |
                           ((short)auVar55._12_2_ >= (short)uVar87) * uVar87;
                  uVar88 = ((short)auVar55._14_2_ < (short)uVar88) * auVar55._14_2_ |
                           ((short)auVar55._14_2_ >= (short)uVar88) * uVar88;
                  auVar97._4_4_ = uVar48;
                  auVar97._0_4_ = uVar48;
                  auVar97._8_4_ = uVar48;
                  auVar97._12_4_ = uVar48;
                  auVar79 = psubsw(auVar55,auVar97);
                  auVar18._4_4_ = uVar49;
                  auVar18._0_4_ = uVar49;
                  auVar18._8_4_ = uVar49;
                  auVar18._12_4_ = uVar49;
                  auVar75 = psubsw(auVar75,auVar18);
                  sVar78 = auVar79._0_2_;
                  sVar74 = auVar75._0_2_;
                  sVar77 = auVar79._2_2_;
                  sVar47 = auVar75._2_2_;
                  sVar7 = auVar79._4_2_;
                  sVar58 = auVar75._4_2_;
                  sVar8 = auVar79._6_2_;
                  sVar60 = auVar75._6_2_;
                  sVar9 = auVar79._8_2_;
                  sVar63 = auVar75._8_2_;
                  sVar10 = auVar79._10_2_;
                  sVar65 = auVar75._10_2_;
                  sVar11 = auVar79._12_2_;
                  sVar68 = auVar75._12_2_;
                  sVar70 = auVar75._14_2_;
                  sVar12 = auVar79._14_2_;
                  puVar1 = (ushort *)((long)*ptr_00 + lVar36);
                  *puVar1 = (ushort)(sVar74 < sVar78) * sVar78 | (ushort)(sVar74 >= sVar78) * sVar74
                  ;
                  puVar1[1] = (ushort)(sVar47 < sVar77) * sVar77 |
                              (ushort)(sVar47 >= sVar77) * sVar47;
                  puVar1[2] = (ushort)(sVar58 < sVar7) * sVar7 | (ushort)(sVar58 >= sVar7) * sVar58;
                  puVar1[3] = (ushort)(sVar60 < sVar8) * sVar8 | (ushort)(sVar60 >= sVar8) * sVar60;
                  puVar1[4] = (ushort)(sVar63 < sVar9) * sVar9 | (ushort)(sVar63 >= sVar9) * sVar63;
                  puVar1[5] = (ushort)(sVar65 < sVar10) * sVar10 |
                              (ushort)(sVar65 >= sVar10) * sVar65;
                  puVar1[6] = (ushort)(sVar68 < sVar11) * sVar11 |
                              (ushort)(sVar68 >= sVar11) * sVar68;
                  puVar1[7] = (ushort)(sVar70 < sVar12) * sVar12 |
                              (ushort)(sVar70 >= sVar12) * sVar70;
                  auVar19._4_4_ = uVar49;
                  auVar19._0_4_ = uVar49;
                  auVar19._8_4_ = uVar49;
                  auVar19._12_4_ = uVar49;
                  auVar79 = psubsw(auVar96,auVar19);
                  sVar74 = auVar79._0_2_;
                  auVar96._0_2_ =
                       (ushort)(sVar74 < sVar78) * sVar78 | (ushort)(sVar74 >= sVar78) * sVar74;
                  sVar78 = auVar79._2_2_;
                  auVar96._2_2_ =
                       (ushort)(sVar78 < sVar77) * sVar77 | (ushort)(sVar78 >= sVar77) * sVar78;
                  sVar78 = auVar79._4_2_;
                  auVar96._4_2_ =
                       (ushort)(sVar78 < sVar7) * sVar7 | (ushort)(sVar78 >= sVar7) * sVar78;
                  sVar78 = auVar79._6_2_;
                  auVar96._6_2_ =
                       (ushort)(sVar78 < sVar8) * sVar8 | (ushort)(sVar78 >= sVar8) * sVar78;
                  sVar78 = auVar79._8_2_;
                  auVar96._8_2_ =
                       (ushort)(sVar78 < sVar9) * sVar9 | (ushort)(sVar78 >= sVar9) * sVar78;
                  sVar78 = auVar79._10_2_;
                  auVar96._10_2_ =
                       (ushort)(sVar78 < sVar10) * sVar10 | (ushort)(sVar78 >= sVar10) * sVar78;
                  sVar78 = auVar79._12_2_;
                  sVar77 = auVar79._14_2_;
                  auVar96._12_2_ =
                       (ushort)(sVar78 < sVar11) * sVar11 | (ushort)(sVar78 >= sVar11) * sVar78;
                  auVar96._14_2_ =
                       (ushort)(sVar77 < sVar12) * sVar12 | (ushort)(sVar77 >= sVar12) * sVar77;
                  auVar95 = *(undefined1 (*) [16])((long)*ptr_02 + lVar36);
                  lVar36 = lVar36 + 0x10;
                  lVar42 = lVar42 + uVar44 * 4;
                  auVar79 = auVar54;
                } while (uVar43 << 4 != lVar36);
                iVar31 = 0;
                do {
                  uVar37 = (ulong)(uint)(ptr_01[uVar41 + 1] - open);
                  if (ptr_01[uVar41 + 1] - open < -0x7fff) {
                    uVar37 = 0xffff8000;
                  }
                  uVar89 = auVar96._0_8_;
                  auVar96._8_8_ = auVar96._8_8_ << 0x10 | uVar89 >> 0x30;
                  auVar96._0_8_ = uVar89 << 0x10 | uVar37 & 0xffff;
                  lVar36 = 0;
                  lVar42 = lVar40;
                  auVar79 = auVar54;
                  do {
                    psVar2 = (short *)((long)*ptr + lVar36);
                    sVar77 = *psVar2;
                    sVar7 = psVar2[1];
                    sVar8 = psVar2[2];
                    sVar9 = psVar2[3];
                    sVar10 = psVar2[4];
                    sVar11 = psVar2[5];
                    sVar12 = psVar2[6];
                    sVar74 = psVar2[7];
                    sVar78 = auVar96._0_2_;
                    auVar56._0_2_ =
                         (ushort)(sVar77 < sVar78) * sVar78 | (ushort)(sVar77 >= sVar78) * sVar77;
                    sVar78 = auVar96._2_2_;
                    auVar56._2_2_ =
                         (ushort)(sVar7 < sVar78) * sVar78 | (ushort)(sVar7 >= sVar78) * sVar7;
                    sVar78 = auVar96._4_2_;
                    auVar56._4_2_ =
                         (ushort)(sVar8 < sVar78) * sVar78 | (ushort)(sVar8 >= sVar78) * sVar8;
                    sVar78 = auVar96._6_2_;
                    auVar56._6_2_ =
                         (ushort)(sVar9 < sVar78) * sVar78 | (ushort)(sVar9 >= sVar78) * sVar9;
                    sVar78 = auVar96._8_2_;
                    auVar56._8_2_ =
                         (ushort)(sVar10 < sVar78) * sVar78 | (ushort)(sVar10 >= sVar78) * sVar10;
                    sVar78 = auVar96._10_2_;
                    auVar56._10_2_ =
                         (ushort)(sVar11 < sVar78) * sVar78 | (ushort)(sVar11 >= sVar78) * sVar11;
                    sVar78 = auVar96._12_2_;
                    auVar56._12_2_ =
                         (ushort)(sVar12 < sVar78) * sVar78 | (ushort)(sVar12 >= sVar78) * sVar12;
                    sVar78 = auVar96._14_2_;
                    auVar56._14_2_ =
                         (ushort)(sVar74 < sVar78) * sVar78 | (ushort)(sVar74 >= sVar78) * sVar74;
                    *(undefined1 (*) [16])((long)*ptr + lVar36) = auVar56;
                    uVar81 = ((short)auVar56._0_2_ < (short)uVar81) * auVar56._0_2_ |
                             ((short)auVar56._0_2_ >= (short)uVar81) * uVar81;
                    uVar82 = ((short)auVar56._2_2_ < (short)uVar82) * auVar56._2_2_ |
                             ((short)auVar56._2_2_ >= (short)uVar82) * uVar82;
                    uVar83 = ((short)auVar56._4_2_ < (short)uVar83) * auVar56._4_2_ |
                             ((short)auVar56._4_2_ >= (short)uVar83) * uVar83;
                    uVar84 = ((short)auVar56._6_2_ < (short)uVar84) * auVar56._6_2_ |
                             ((short)auVar56._6_2_ >= (short)uVar84) * uVar84;
                    uVar85 = ((short)auVar56._8_2_ < (short)uVar85) * auVar56._8_2_ |
                             ((short)auVar56._8_2_ >= (short)uVar85) * uVar85;
                    uVar86 = ((short)auVar56._10_2_ < (short)uVar86) * auVar56._10_2_ |
                             ((short)auVar56._10_2_ >= (short)uVar86) * uVar86;
                    uVar87 = ((short)auVar56._12_2_ < (short)uVar87) * auVar56._12_2_ |
                             ((short)auVar56._12_2_ >= (short)uVar87) * uVar87;
                    uVar88 = ((short)auVar56._14_2_ < (short)uVar88) * auVar56._14_2_ |
                             ((short)auVar56._14_2_ >= (short)uVar88) * uVar88;
                    sVar78 = auVar79._0_2_;
                    auVar54._0_2_ =
                         (sVar78 < (short)auVar56._0_2_) * auVar56._0_2_ |
                         (ushort)(sVar78 >= (short)auVar56._0_2_) * sVar78;
                    sVar78 = auVar79._2_2_;
                    auVar54._2_2_ =
                         (sVar78 < (short)auVar56._2_2_) * auVar56._2_2_ |
                         (ushort)(sVar78 >= (short)auVar56._2_2_) * sVar78;
                    sVar78 = auVar79._4_2_;
                    auVar54._4_2_ =
                         (sVar78 < (short)auVar56._4_2_) * auVar56._4_2_ |
                         (ushort)(sVar78 >= (short)auVar56._4_2_) * sVar78;
                    sVar78 = auVar79._6_2_;
                    auVar54._6_2_ =
                         (sVar78 < (short)auVar56._6_2_) * auVar56._6_2_ |
                         (ushort)(sVar78 >= (short)auVar56._6_2_) * sVar78;
                    sVar78 = auVar79._8_2_;
                    auVar54._8_2_ =
                         (sVar78 < (short)auVar56._8_2_) * auVar56._8_2_ |
                         (ushort)(sVar78 >= (short)auVar56._8_2_) * sVar78;
                    sVar78 = auVar79._10_2_;
                    auVar54._10_2_ =
                         (sVar78 < (short)auVar56._10_2_) * auVar56._10_2_ |
                         (ushort)(sVar78 >= (short)auVar56._10_2_) * sVar78;
                    sVar78 = auVar79._12_2_;
                    sVar77 = auVar79._14_2_;
                    auVar54._12_2_ =
                         (sVar78 < (short)auVar56._12_2_) * auVar56._12_2_ |
                         (ushort)(sVar78 >= (short)auVar56._12_2_) * sVar78;
                    auVar54._14_2_ =
                         (sVar77 < (short)auVar56._14_2_) * auVar56._14_2_ |
                         (ushort)(sVar77 >= (short)auVar56._14_2_) * sVar77;
                    piVar6 = ((ppVar32->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar42) = (int)(short)auVar56._0_2_;
                    *(int *)((long)piVar6 + lVar34 * 4 + lVar42) = (int)(short)auVar56._2_2_;
                    *(int *)((long)piVar6 + lVar34 * 8 + lVar42) = (int)(short)auVar56._4_2_;
                    *(int *)((long)piVar6 + lVar34 * 0xc + lVar42) = (int)(short)auVar56._6_2_;
                    *(int *)((long)piVar6 + lVar34 * 0x10 + lVar42) = (int)(short)auVar56._8_2_;
                    *(int *)((long)piVar6 + lVar34 * 0x14 + lVar42) = (int)(short)auVar56._10_2_;
                    *(int *)((long)piVar6 + lVar34 * 0x18 + lVar42) = (int)(short)auVar56._12_2_;
                    *(int *)((long)piVar6 + lVar34 * 0x1c + lVar42) = (int)(short)auVar56._14_2_;
                    auVar17._4_4_ = uVar48;
                    auVar17._0_4_ = uVar48;
                    auVar17._8_4_ = uVar48;
                    auVar17._12_4_ = uVar48;
                    auVar79 = psubsw(auVar56,auVar17);
                    auVar20._4_4_ = uVar49;
                    auVar20._0_4_ = uVar49;
                    auVar20._8_4_ = uVar49;
                    auVar20._12_4_ = uVar49;
                    auVar96 = psubsw(auVar96,auVar20);
                    auVar76._0_2_ = -(ushort)(auVar79._0_2_ < auVar96._0_2_);
                    auVar76._2_2_ = -(ushort)(auVar79._2_2_ < auVar96._2_2_);
                    auVar76._4_2_ = -(ushort)(auVar79._4_2_ < auVar96._4_2_);
                    auVar76._6_2_ = -(ushort)(auVar79._6_2_ < auVar96._6_2_);
                    auVar76._8_2_ = -(ushort)(auVar79._8_2_ < auVar96._8_2_);
                    auVar76._10_2_ = -(ushort)(auVar79._10_2_ < auVar96._10_2_);
                    auVar76._12_2_ = -(ushort)(auVar79._12_2_ < auVar96._12_2_);
                    auVar76._14_2_ = -(ushort)(auVar79._14_2_ < auVar96._14_2_);
                    if ((((((((((((((((auVar76 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar76 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar76 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar76 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar76 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar76 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar76 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar76 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar76 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar76 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar76 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar76 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar76._14_2_ >> 7 & 1) == 0) && (auVar76._14_2_ & 0x8000) == 0)
                    goto LAB_006c70eb;
                    lVar36 = lVar36 + 0x10;
                    lVar42 = lVar42 + uVar44 * 4;
                    auVar79 = auVar54;
                  } while (uVar43 << 4 != lVar36);
                  iVar31 = iVar31 + 1;
                } while (iVar31 != 8);
LAB_006c70eb:
                uVar41 = uVar41 + 1;
                lVar40 = lVar40 + 4;
                palVar33 = ptr_02;
                if (uVar41 == uVar44) {
                  uVar44 = ptr[(ulong)uVar29 % uVar43][1];
                  if (iVar45 < 7) {
                    iVar31 = 0;
                    uVar43 = ptr[(ulong)uVar29 % uVar43][0];
                    do {
                      uVar44 = uVar44 << 0x10 | uVar43 >> 0x30;
                      iVar31 = iVar31 + 1;
                      uVar43 = uVar43 << 0x10;
                    } while (iVar31 < 7 - iVar45);
                  }
                  sVar78 = auVar53._0_2_;
                  auVar94._0_2_ = -(ushort)((short)uVar81 < sVar78);
                  sVar77 = auVar53._2_2_;
                  auVar94._2_2_ = -(ushort)((short)uVar82 < sVar77);
                  auVar94._4_2_ = -(ushort)((short)uVar83 < sVar78);
                  auVar94._6_2_ = -(ushort)((short)uVar84 < sVar77);
                  auVar94._8_2_ = -(ushort)((short)uVar85 < sVar78);
                  auVar94._10_2_ = -(ushort)((short)uVar86 < sVar77);
                  auVar94._12_2_ = -(ushort)((short)uVar87 < sVar78);
                  auVar94._14_2_ = -(ushort)((short)uVar88 < sVar77);
                  auVar53._0_2_ = -(ushort)((short)local_78 < (short)auVar54._0_2_);
                  auVar53._2_2_ = -(ushort)((short)uStack_76 < (short)auVar54._2_2_);
                  auVar53._4_2_ = -(ushort)((short)local_78 < (short)auVar54._4_2_);
                  auVar53._6_2_ = -(ushort)((short)uStack_76 < (short)auVar54._6_2_);
                  auVar53._8_2_ = -(ushort)((short)local_78 < (short)auVar54._8_2_);
                  auVar53._10_2_ = -(ushort)((short)uStack_76 < (short)auVar54._10_2_);
                  auVar53._12_2_ = -(ushort)((short)local_78 < (short)auVar54._12_2_);
                  auVar53._14_2_ = -(ushort)((short)uStack_76 < (short)auVar54._14_2_);
                  auVar53 = auVar53 | auVar94;
                  if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar53 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar53 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar53[0xf]) {
                    sVar78 = (short)(uVar44 >> 0x30);
                  }
                  else {
                    *(byte *)&ppVar32->flag = (byte)ppVar32->flag | 0x40;
                    sVar78 = 0;
                    iVar30 = 0;
                    uVar29 = 0;
                  }
                  ppVar32->score = (int)sVar78;
                  ppVar32->end_query = uVar29;
                  ppVar32->end_ref = iVar30;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar32;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}